

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  bool bVar1;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  allocator<char> local_39;
  string local_38;
  TestProperty *local_18;
  TestProperty *test_property_local;
  string *xml_element_local;
  
  local_18 = test_property;
  test_property_local = (TestProperty *)xml_element;
  __s = TestProperty::key(test_property);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  GetReservedAttributesForElement(&local_68,&test_property_local->key_);
  bVar1 = ValidateTestPropertyName(&local_38,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return bVar1;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}